

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCopyFile(Btree *pTo,Btree *pFrom)

{
  int iVar1;
  u32 uVar2;
  Pager *pPVar3;
  long local_78;
  i64 nByte;
  sqlite3_backup b;
  sqlite3_file *pFd;
  int rc;
  Btree *pFrom_local;
  Btree *pTo_local;
  
  sqlite3BtreeEnter(pTo);
  sqlite3BtreeEnter(pFrom);
  pPVar3 = sqlite3BtreePager(pTo);
  b.pNext = (sqlite3_backup *)sqlite3PagerFile(pPVar3);
  if ((b.pNext)->pDestDb != (sqlite3 *)0x0) {
    iVar1 = sqlite3BtreeGetPageSize(pFrom);
    uVar2 = sqlite3BtreeLastPage(pFrom);
    local_78 = (long)iVar1 * (ulong)uVar2;
    pFd._4_4_ = sqlite3OsFileControl((sqlite3_file *)b.pNext,0xb,&local_78);
    if (pFd._4_4_ == 0xc) {
      pFd._4_4_ = 0;
    }
    if (pFd._4_4_ != 0) goto LAB_00421052;
  }
  memset(&nByte,0,0x48);
  b._24_8_ = pFrom->db;
  b.iDestSchema = 1;
  b.pDestDb = (sqlite3 *)pTo;
  b.pSrcDb = (sqlite3 *)pFrom;
  sqlite3_backup_step((sqlite3_backup *)&nByte,0x7fffffff);
  pFd._4_4_ = sqlite3_backup_finish((sqlite3_backup *)&nByte);
  if (pFd._4_4_ == 0) {
    pTo->pBt->btsFlags = pTo->pBt->btsFlags & 0xfffd;
  }
  else {
    pPVar3 = sqlite3BtreePager((Btree *)b.pDestDb);
    sqlite3PagerClearCache(pPVar3);
  }
LAB_00421052:
  sqlite3BtreeLeave(pFrom);
  sqlite3BtreeLeave(pTo);
  return pFd._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCopyFile(Btree *pTo, Btree *pFrom){
  int rc;
  sqlite3_file *pFd;              /* File descriptor for database pTo */
  sqlite3_backup b;
  sqlite3BtreeEnter(pTo);
  sqlite3BtreeEnter(pFrom);

  assert( sqlite3BtreeIsInTrans(pTo) );
  pFd = sqlite3PagerFile(sqlite3BtreePager(pTo));
  if( pFd->pMethods ){
    i64 nByte = sqlite3BtreeGetPageSize(pFrom)*(i64)sqlite3BtreeLastPage(pFrom);
    rc = sqlite3OsFileControl(pFd, SQLITE_FCNTL_OVERWRITE, &nByte);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
    if( rc ) goto copy_finished;
  }

  /* Set up an sqlite3_backup object. sqlite3_backup.pDestDb must be set
  ** to 0. This is used by the implementations of sqlite3_backup_step()
  ** and sqlite3_backup_finish() to detect that they are being called
  ** from this function, not directly by the user.
  */
  memset(&b, 0, sizeof(b));
  b.pSrcDb = pFrom->db;
  b.pSrc = pFrom;
  b.pDest = pTo;
  b.iNext = 1;

#ifdef SQLITE_HAS_CODEC
  sqlite3PagerAlignReserve(sqlite3BtreePager(pTo), sqlite3BtreePager(pFrom));
#endif

  /* 0x7FFFFFFF is the hard limit for the number of pages in a database
  ** file. By passing this as the number of pages to copy to
  ** sqlite3_backup_step(), we can guarantee that the copy finishes 
  ** within a single call (unless an error occurs). The assert() statement
  ** checks this assumption - (p->rc) should be set to either SQLITE_DONE 
  ** or an error code.  */
  sqlite3_backup_step(&b, 0x7FFFFFFF);
  assert( b.rc!=SQLITE_OK );

  rc = sqlite3_backup_finish(&b);
  if( rc==SQLITE_OK ){
    pTo->pBt->btsFlags &= ~BTS_PAGESIZE_FIXED;
  }else{
    sqlite3PagerClearCache(sqlite3BtreePager(b.pDest));
  }

  assert( sqlite3BtreeIsInTrans(pTo)==0 );
copy_finished:
  sqlite3BtreeLeave(pFrom);
  sqlite3BtreeLeave(pTo);
  return rc;
}